

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O2

bool __thiscall argh::parser::is_number(parser *this,string *arg)

{
  byte bVar1;
  double number;
  istringstream istr;
  byte abStack_168 [352];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&istr,(string *)arg,_S_in);
  std::istream::_M_extract<double>((double *)&istr);
  bVar1 = abStack_168[*(long *)(_istr + -0x18)];
  std::__cxx11::istringstream::~istringstream((istringstream *)&istr);
  return (bVar1 & 5) == 0;
}

Assistant:

inline bool parser::is_number(std::string const& arg) const
	{
		// inefficient but simple way to determine if a string is a number (which can start with a '-')
		std::istringstream istr(arg);
		double number;
		istr >> number;
		return !(istr.fail() || istr.bad());
	}